

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

pair<double,_unsigned_long> compute_entropy(uint32_t *input,size_t n)

{
  bool bVar1;
  mapped_type *pmVar2;
  ulong in_RSI;
  long in_RDI;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false> *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double p;
  pair<const_unsigned_int,_unsigned_long> *c;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *__range1;
  double nn;
  double H0;
  uint32_t num;
  size_t i;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  freqs;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *in_stack_ffffffffffffff28;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *in_stack_ffffffffffffff30;
  size_type local_c0;
  double local_b8;
  _Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false> *local_b0;
  reference local_a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false> local_a0;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_long>,_false> local_98;
  undefined1 *local_90;
  double local_88;
  ulong local_80;
  undefined4 local_64;
  ulong local_60;
  undefined1 local_58 [56];
  ulong local_20;
  long local_18;
  pair<double,_unsigned_long> local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  std::
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                   *)0x183f74);
  for (local_60 = 0; local_60 < local_20; local_60 = local_60 + 1) {
    local_64 = *(undefined4 *)(local_18 + local_60 * 4);
    pmVar2 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::operator[](in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
    *pmVar2 = *pmVar2 + 1;
  }
  local_80 = 0;
  auVar5 = vcvtusi2sd_avx512f((undefined1  [16])0x0,local_20);
  auVar4 = ZEXT1664(auVar5);
  local_88 = auVar5._0_8_;
  local_90 = local_58;
  local_98._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
       ::begin(in_stack_ffffffffffffff28);
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff28);
  while( true ) {
    auVar5 = auVar4._0_16_;
    bVar1 = std::__detail::operator!=(&local_98,&local_a0);
    if (!bVar1) break;
    local_a8 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false>::operator*
                         ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false>
                           *)0x18405a);
    auVar5 = vcvtusi2sd_avx512f(auVar5,local_a8->second);
    this = (_Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false> *)
           (auVar5._0_8_ / local_88);
    local_b0 = this;
    auVar4._0_8_ = log2((double)this);
    auVar4._8_56_ = extraout_var;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_80;
    auVar5 = vfmadd213sd_fma(auVar4._0_16_,auVar5,auVar7);
    auVar4 = ZEXT1664(auVar5);
    local_80 = auVar5._0_8_;
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_long>,_false,_false>::
    operator++(this);
  }
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_80;
  local_b8 = (double)vmovlpd_avx(auVar3 ^ auVar6);
  local_c0 = std::
             unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::size((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                     *)0x1840d7);
  std::pair<double,_unsigned_long>::pair<double,_unsigned_long,_true>(&local_10,&local_b8,&local_c0)
  ;
  std::
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)0x184102);
  return local_10;
}

Assistant:

std::pair<double, size_t> compute_entropy(const uint32_t* input, size_t n)
{
    std::unordered_map<uint32_t, uint64_t> freqs;
    for (size_t i = 0; i < n; i++) {
        uint32_t num = input[i];
        freqs[num] += 1;
    }
    double H0 = 0.0;
    double nn = n;
    for (const auto& c : freqs) {
        double p = double(c.second) / nn;
        H0 += (p * log2(p));
    }
    return { -H0, freqs.size() };
}